

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void __thiscall
duckdb::HistogramBinState<short>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<short> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  bool bVar1;
  undefined8 *puVar2;
  BinderException *pBVar3;
  size_type sVar4;
  reference left;
  idx_t in_RCX;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  size_type *in_RDI;
  idx_t i_1;
  idx_t bin_child_idx;
  idx_t i;
  bool extra_state;
  UnifiedVectorFormat bin_child_data;
  idx_t bin_count;
  Vector *bin_child;
  list_entry_t bin_list;
  idx_t bin_index;
  list_entry_t *bin_counts;
  UnifiedVectorFormat bin_data;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  AggregateInputData *in_stack_fffffffffffffde0;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> in_stack_fffffffffffffde8;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> in_stack_fffffffffffffdf0;
  ulong uVar5;
  size_type in_stack_fffffffffffffdf8;
  undefined6 in_stack_fffffffffffffe00;
  short in_stack_fffffffffffffe06;
  size_type in_stack_fffffffffffffe08;
  vector<short,_std::allocator<short>_> *in_stack_fffffffffffffe10;
  allocator *paVar6;
  ulong local_180;
  allocator local_161;
  string local_160 [32];
  idx_t local_140;
  ulong local_138;
  undefined1 local_129;
  SelectionVector *local_128 [9];
  idx_t local_e0;
  undefined8 local_d8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  uint64_t local_a8;
  uint64_t uStack_a0;
  idx_t local_90;
  list_entry_t *local_88;
  SelectionVector *local_70 [10];
  idx_t local_20;
  UnifiedVectorFormat *local_18;
  Vector *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  vector<short,_false>::vector((vector<short,_false> *)0xb7ee21);
  *in_RDI = (size_type)puVar2;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  vector<unsigned_long,_false>::vector((vector<unsigned_long,_false> *)0xb7ee5e);
  in_RDI[1] = (size_type)puVar2;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)local_10,local_18);
  local_88 = UnifiedVectorFormat::GetData<duckdb::list_entry_t>((UnifiedVectorFormat *)local_70);
  local_90 = SelectionVector::get_index(local_70[0],local_20);
  local_a8 = local_88[local_90].offset;
  uStack_a0 = local_88[local_90].length;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffde8._M_current,
                     (idx_t)in_stack_fffffffffffffde0);
  if (!bVar1) {
    local_ca = 1;
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Histogram bin list cannot be NULL",&local_c9);
    duckdb::BinderException::BinderException(pBVar3,local_c8);
    local_ca = 0;
    __cxa_throw(pBVar3,&BinderException::typeinfo,BinderException::~BinderException);
  }
  local_d8 = duckdb::ListVector::GetEntry(local_10);
  local_e0 = duckdb::ListVector::GetListSize(local_10);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_128);
  local_129 = HistogramFunctor::CreateExtraState(local_e0);
  HistogramFunctor::PrepareData
            ((Vector *)in_stack_fffffffffffffdf0._M_current,
             (idx_t)in_stack_fffffffffffffde8._M_current,(bool *)in_stack_fffffffffffffde0,
             (UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  std::vector<short,_std::allocator<short>_>::reserve
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_138 = 0;
  while( true ) {
    if (uStack_a0 <= local_138) {
      std::vector<short,_std::allocator<short>_>::begin
                ((vector<short,_std::allocator<short>_> *)
                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      std::vector<short,_std::allocator<short>_>::end
                ((vector<short,_std::allocator<short>_> *)
                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      std::sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      local_180 = 1;
      while (uVar5 = local_180,
            sVar4 = std::vector<short,_std::allocator<short>_>::size
                              ((vector<short,_std::allocator<short>_> *)*in_RDI), uVar5 < sVar4) {
        left = vector<short,_false>::operator[]
                         ((vector<short,_false> *)in_stack_fffffffffffffde0,
                          CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        in_stack_fffffffffffffde0 =
             (AggregateInputData *)
             vector<short,_false>::operator[]
                       ((vector<short,_false> *)in_stack_fffffffffffffde0,
                        CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        in_stack_fffffffffffffddf =
             duckdb::Equals::Operation<short>(left,(short *)in_stack_fffffffffffffde0);
        if ((bool)in_stack_fffffffffffffddf) {
          vector<short,_false>::erase_at
                    ((vector<short,_false> *)in_stack_fffffffffffffde0,
                     CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
          local_180 = local_180 - 1;
        }
        local_180 = local_180 + 1;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT26(in_stack_fffffffffffffe06,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffde0);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffde0);
      return;
    }
    local_140 = SelectionVector::get_index(local_128[0],local_a8 + local_138);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffde8._M_current,
                       (idx_t)in_stack_fffffffffffffde0);
    if (!bVar1) break;
    in_stack_fffffffffffffdf8 = *in_RDI;
    in_stack_fffffffffffffe06 =
         HistogramFunctor::ExtractValue<short>
                   ((UnifiedVectorFormat *)in_stack_fffffffffffffdf0._M_current,
                    (idx_t)in_stack_fffffffffffffde8._M_current,in_stack_fffffffffffffde0);
    std::vector<short,_std::allocator<short>_>::push_back
              ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffde0,
               (value_type_conflict4 *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8)
              );
    local_138 = local_138 + 1;
  }
  pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
  paVar6 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"Histogram bin entry cannot be NULL",paVar6);
  duckdb::BinderException::BinderException(pBVar3,local_160);
  __cxa_throw(pBVar3,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}